

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TextureUnitCase::upload2dArrayTexture
          (TextureUnitCase *this,int texNdx,Context *context)

{
  Texture2DArray *pTVar1;
  deUint32 err;
  TextureFormat texFormat;
  TransferFormat TVar2;
  long lVar3;
  pointer pPVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  pTVar1 = (this->m_textures2dArray).
           super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>._M_impl
           .super__Vector_impl_data._M_start
           [(this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[texNdx]];
  texFormat = glu::mapGLInternalFormat
                        ((this->m_textureParams).
                         super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                         ._M_impl.super__Vector_impl_data._M_start[texNdx].internalFormat);
  TVar2 = glu::getTransferFormat(texFormat);
  (*context->_vptr_Context[0xf])(context,0xcf5,1);
  lVar3 = *(long *)&(pTVar1->super_TextureLevelPyramid).m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data;
  pPVar4 = (pTVar1->super_TextureLevelPyramid).m_access.
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pPVar4 - lVar3) >> 3) * -0x33333333) {
    lVar5 = 8;
    uVar6 = 0;
    lVar7 = 8;
    do {
      if (*(long *)(*(long *)&(pTVar1->super_TextureLevelPyramid).m_data.
                              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                              ._M_impl.super__Vector_impl_data + lVar7) != 0) {
        (*context->_vptr_Context[0x12])
                  (context,0x8c1a,uVar6 & 0xffffffff,
                   (ulong)(this->m_textureParams).
                          super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                          ._M_impl.super__Vector_impl_data._M_start[texNdx].internalFormat,
                   (ulong)*(uint *)(lVar3 + lVar5),(ulong)*(uint *)(lVar3 + 4 + lVar5),
                   (ulong)*(uint *)(lVar3 + 8 + lVar5),0,TVar2,(ulong)TVar2 >> 0x20,
                   *(undefined8 *)(lVar3 + 0x18 + lVar5));
        err = (*context->_vptr_Context[0x79])(context);
        glu::checkError(err,"Set 2d array texture image data",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                        ,0x468);
        lVar3 = *(long *)&(pTVar1->super_TextureLevelPyramid).m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data;
        pPVar4 = (pTVar1->super_TextureLevelPyramid).m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x10;
      lVar5 = lVar5 + 0x28;
    } while ((long)uVar6 < (long)((int)((ulong)((long)pPVar4 - lVar3) >> 3) * -0x33333333));
  }
  return;
}

Assistant:

void TextureUnitCase::upload2dArrayTexture (int texNdx, sglr::Context& context)
{
	int							ndx2dArray	= m_ndxTexType[texNdx];
	const tcu::Texture2DArray*	texture		= m_textures2dArray[ndx2dArray];
	glu::TransferFormat			formatGl	= glu::getTransferFormat(glu::mapGLInternalFormat(m_textureParams[texNdx].internalFormat));

	context.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

	for (int levelNdx = 0; levelNdx < texture->getNumLevels(); levelNdx++)
	{
		if (texture->isLevelEmpty(levelNdx))
			continue;

		tcu::ConstPixelBufferAccess	access	= texture->getLevel(levelNdx);
		int							width	= access.getWidth();
		int							height	= access.getHeight();
		int							layers	= access.getDepth();

		DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*width);
		DE_ASSERT(access.getSlicePitch() == access.getFormat().getPixelSize()*width*height);

		context.texImage3D(GL_TEXTURE_2D_ARRAY, levelNdx, m_textureParams[texNdx].internalFormat, width, height, layers, 0 /* border */, formatGl.format, formatGl.dataType, access.getDataPtr());
		GLU_EXPECT_NO_ERROR(context.getError(), "Set 2d array texture image data");
	}
}